

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

void Fra_ClausFree(Clu_Man_t *p)

{
  Vec_Ptr_t *__ptr;
  
  __ptr = p->vCexes;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr->pArray);
    free(__ptr);
  }
  if (p->vLits != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vLits);
  }
  if (p->vClauses != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vClauses);
  }
  if (p->vLitsProven != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vLitsProven);
  }
  if (p->vClausesProven != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vClausesProven);
  }
  if (p->vCosts != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vCosts);
  }
  if (p->pCnf != (Cnf_Dat_t *)0x0) {
    Cnf_DataFree(p->pCnf);
  }
  if (p->pSatMain != (sat_solver *)0x0) {
    sat_solver_delete(p->pSatMain);
  }
  if (p->pSatBmc != (sat_solver *)0x0) {
    sat_solver_delete(p->pSatBmc);
  }
  free(p);
  return;
}

Assistant:

void Fra_ClausFree( Clu_Man_t * p )
{
    if ( p->vCexes )    Vec_PtrFree( p->vCexes );
    if ( p->vLits )     Vec_IntFree( p->vLits );
    if ( p->vClauses )  Vec_IntFree( p->vClauses );
    if ( p->vLitsProven )     Vec_IntFree( p->vLitsProven );
    if ( p->vClausesProven )  Vec_IntFree( p->vClausesProven );
    if ( p->vCosts )    Vec_IntFree( p->vCosts );
    if ( p->pCnf )      Cnf_DataFree( p->pCnf );
    if ( p->pSatMain )  sat_solver_delete( p->pSatMain );
    if ( p->pSatBmc )   sat_solver_delete( p->pSatBmc );
    ABC_FREE( p );
}